

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,Pubkey *pubkey,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list,ByteData *finterprint)

{
  ByteData *finterprint_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *child_num_list_local;
  Pubkey *pubkey_local;
  KeyData *this_local;
  
  Pubkey::Pubkey(&this->pubkey_,pubkey);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_,child_num_list);
  ByteData::ByteData(&this->fingerprint_,finterprint);
  return;
}

Assistant:

KeyData::KeyData(
    const Pubkey& pubkey, const std::vector<uint32_t>& child_num_list,
    const ByteData& finterprint)
    : pubkey_(pubkey), path_(child_num_list), fingerprint_(finterprint) {
  // do nothing
}